

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O3

MPP_RET mpp_buffer_set_offset_with_caller(MppBuffer buffer,size_t offset,char *caller)

{
  if (buffer != (MppBuffer)0x0) {
    *(size_t *)((long)buffer + 0xa8) = offset;
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_buffer","mpp_buffer_set_offset invalid NULL input from %s\n",(char *)0x0,caller)
  ;
  return MPP_ERR_UNKNOW;
}

Assistant:

MPP_RET mpp_buffer_set_offset_with_caller(MppBuffer buffer, size_t offset, const char *caller)
{
    if (NULL == buffer) {
        mpp_err("mpp_buffer_set_offset invalid NULL input from %s\n", caller);
        return MPP_ERR_UNKNOW;
    }

    MppBufferImpl *p = (MppBufferImpl*)buffer;
    p->offset = offset;
    return MPP_OK;
}